

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  ostream *poVar4;
  int iVar5;
  undefined1 local_500 [8];
  Parg pg;
  Hr hr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  allocator<char> local_21;
  
  OB::Parg::Parg((Parg *)local_500,argc,argv);
  iVar2 = program_options((Parg *)local_500);
  iVar5 = 0;
  if (iVar2 < 1) {
    iVar5 = 1;
    if (-1 < iVar2) {
      OB::Hr::Hr((Hr *)&pg.similar_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"string",(allocator<char> *)&local_f0);
      OB::Parg::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_130,(Parg *)local_500,&local_70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"\n",(allocator<char> *)&local_d0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_21);
      OB::String::replace(&local_48,&local_130,&local_90,&local_b0);
      OB::Hr::fill((Hr *)&pg.similar_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"text",&local_21);
      OB::Parg::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_70,(Parg *)local_500,&local_90);
      std::__cxx11::string::string
                ((string *)&local_b0,
                 (string *)
                 &pg.positional_vec_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator+(&local_110,&local_70,&local_b0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"\n",&local_4a);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_49);
      OB::String::replace(&local_48,&local_110,&local_f0,&local_d0);
      OB::Hr::text((Hr *)&pg.similar_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"align",(allocator<char> *)&local_90);
      OB::Parg::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_48,(Parg *)local_500,&local_70);
      OB::Hr::align((Hr *)&pg.similar_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"bold",(allocator<char> *)&local_70);
      bVar1 = OB::Parg::get<bool,_0>((Parg *)local_500,&local_48);
      OB::Hr::bold((Hr *)&pg.similar_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,bVar1);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"underline",(allocator<char> *)&local_70);
      bVar1 = OB::Parg::get<bool,_0>((Parg *)local_500,&local_48);
      OB::Hr::underline((Hr *)&pg.similar_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,bVar1);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"colour",(allocator<char> *)&local_90);
      OB::Parg::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_48,(Parg *)local_500,&local_70);
      OB::Hr::color((Hr *)&pg.similar_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"colour-fg",(allocator<char> *)&local_90);
      OB::Parg::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_48,(Parg *)local_500,&local_70);
      OB::Hr::color_fg((Hr *)&pg.similar_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"colour-bg",(allocator<char> *)&local_90);
      OB::Parg::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_48,(Parg *)local_500,&local_70);
      OB::Hr::color_bg((Hr *)&pg.similar_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"columns",(allocator<char> *)&local_70);
      uVar3 = OB::Parg::get<unsigned_long,_0>((Parg *)local_500,&local_48);
      OB::Hr::width((Hr *)&pg.similar_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar3);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"rows",(allocator<char> *)&local_70);
      uVar3 = OB::Parg::get<unsigned_long,_0>((Parg *)local_500,&local_48);
      OB::Hr::height((Hr *)&pg.similar_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar3);
      std::__cxx11::string::~string((string *)&local_48);
      OB::Hr::render_abi_cxx11_
                ((string *)((long)&hr.buf_.field_2 + 8),
                 (Hr *)&pg.similar_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)(hr.buf_.field_2._M_local_buf + 8));
      poVar4 = std::operator<<((ostream *)&std::cout,"\r");
      OB::Hr::str_abi_cxx11_
                (&local_48,
                 (Hr *)&pg.similar_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar4,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      OB::Hr::~Hr((Hr *)&pg.similar_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar5 = 0;
    }
  }
  OB::Parg::~Parg((Parg *)local_500);
  return iVar5;
}

Assistant:

int main(int argc, char *argv[])
{
  Parg pg {argc, argv};
  int pstatus {program_options(pg)};
  if (pstatus > 0) return 0;
  if (pstatus < 0) return 1;

  try
  {
    Hr hr;
    hr.fill(OB::String::replace(pg.get<std::string>("string"), "\n", ""));
    hr.text(OB::String::replace(pg.get<std::string>("text") + pg.get_stdin(), "\n", ""));
    hr.align(pg.get<std::string>("align"));
    hr.bold(pg.get<bool>("bold"));
    hr.underline(pg.get<bool>("underline"));
    hr.color(pg.get<std::string>("colour"));
    hr.color_fg(pg.get<std::string>("colour-fg"));
    hr.color_bg(pg.get<std::string>("colour-bg"));
    hr.width(pg.get<std::size_t>("columns"));
    hr.height(pg.get<std::size_t>("rows"));
    hr.render();

    std::cout << "\r" << hr.str();
  }
  catch (std::exception const& e)
  {
    std::cerr << "Error: " << e.what() << "\n";

    return 1;
  }

  return 0;
}